

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConn.cpp
# Opt level: O0

void __thiscall TcpConn::~TcpConn(TcpConn *this)

{
  TcpConn *this_local;
  
  (this->super_PollObj)._vptr_PollObj = (_func_int **)&PTR__TcpConn_0010bcf8;
  (this->super_Buffer)._vptr_Buffer = (_func_int **)&PTR_Alloc_0010bd60;
  if ((this->super_PollObj).m_pPoller != (Poller *)0x0) {
    Poller::Remove((this->super_PollObj).m_pPoller,&this->super_PollObj);
  }
  Buffer::Clear(&this->super_Buffer);
  TcpSocket::~TcpSocket(&this->m_socket);
  PollObj::~PollObj(&this->super_PollObj);
  return;
}

Assistant:

TcpConn::~TcpConn()
{
    if(this->m_pPoller != nullptr)
        m_pPoller->Remove(this);
    Clear();
}